

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

Result * __thiscall
GeneticAlgorithm::operator()
          (Result *__return_storage_ptr__,GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  string *this_00;
  element_type *this_01;
  reference pvVar5;
  reference pIVar6;
  Individual *pIVar7;
  shared_ptr<Instance> local_180;
  Individual local_170;
  undefined1 local_148 [8];
  Individual ind;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  Individual child;
  Individual *mother;
  undefined1 local_d0 [4];
  int j;
  Individual father;
  int i_1;
  int startingSize;
  int i;
  undefined1 local_90 [4];
  int rewriteToNextPopulationCount;
  shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_> newPopulation;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68 [3];
  shared_ptr<Instance> local_50;
  int local_3c;
  duration<long,std::ratio<1l,1l>> local_38 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point start;
  shared_ptr<Instance> *instance_local;
  GeneticAlgorithm *this_local;
  
  end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_3c = 5;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_38,&local_3c);
  local_30 = std::chrono::operator+(&end,(duration<long,_std::ratio<1L,_1L>_> *)local_38);
  std::shared_ptr<Instance>::shared_ptr(&local_50,instance);
  initializePopulation(this,&local_50);
  std::shared_ptr<Instance>::~shared_ptr(&local_50);
  while( true ) {
    local_68[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator<(local_68,&local_30);
    if (!bVar1) {
      std::shared_ptr<Instance>::shared_ptr(&local_180,instance);
      pIVar7 = returnBestIndividual(this,&local_180);
      Individual::Individual(&local_170,pIVar7);
      Result::Result(__return_storage_ptr__,&local_170);
      Individual::~Individual(&local_170);
      std::shared_ptr<Instance>::~shared_ptr(&local_180);
      return __return_storage_ptr__;
    }
    peVar3 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->population);
    __first = std::vector<Individual,_std::allocator<Individual>_>::begin(peVar3);
    peVar3 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->population);
    __last = std::vector<Individual,_std::allocator<Individual>_>::end(peVar3);
    newPopulation.
    super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)instance;
    std::operator()((__normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_>
                     )__first._M_current,
                    (__normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_>
                     )__last._M_current,(anon_class_8_1_0902ba13)instance);
    std::make_shared<std::vector<Individual,std::allocator<Individual>>>();
    i = 0x14;
    peVar3 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->population);
    sVar4 = std::vector<Individual,_std::allocator<Individual>_>::size(peVar3);
    if (sVar4 < 0x14) break;
    for (i_1 = 0; i_1 < i; i_1 = i_1 + 1) {
      peVar3 = std::
               __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      this_01 = std::
                __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->population);
      pvVar5 = std::vector<Individual,_std::allocator<Individual>_>::at(this_01,(long)i_1);
      std::vector<Individual,_std::allocator<Individual>_>::push_back(peVar3,pvVar5);
    }
    peVar3 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_90);
    sVar4 = std::vector<Individual,_std::allocator<Individual>_>::size(peVar3);
    for (father.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_ = 0;
        father.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ < (int)sVar4;
        father.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = father.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ + 1) {
      peVar3 = std::
               __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      pvVar5 = std::vector<Individual,_std::allocator<Individual>_>::at
                         (peVar3,(long)father.usedInstance.
                                       super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi._4_4_);
      Individual::Individual((Individual *)local_d0,pvVar5);
      for (mother._4_4_ = 0; mother._4_4_ < (int)sVar4; mother._4_4_ = mother._4_4_ + 1) {
        if (father.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi._4_4_ != mother._4_4_) {
          peVar3 = std::
                   __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_90);
          child.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::vector<Individual,_std::allocator<Individual>_>::at
                            (peVar3,(long)mother._4_4_);
          Individual::makeOffspring
                    ((Individual *)&__range2,(Individual *)local_d0,
                     (Individual *)
                     child.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          peVar3 = std::
                   __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_90);
          std::vector<Individual,_std::allocator<Individual>_>::push_back
                    (peVar3,(value_type *)&__range2);
          Individual::~Individual((Individual *)&__range2);
        }
      }
      Individual::~Individual((Individual *)local_d0);
    }
    peVar3 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_90);
    __end2 = std::vector<Individual,_std::allocator<Individual>_>::begin(peVar3);
    ind.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<Individual,_std::allocator<Individual>_>::end(peVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_>
                                  *)&ind.usedInstance.
                                     super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
      if (!bVar1) break;
      pIVar6 = __gnu_cxx::
               __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_>
               ::operator*(&__end2);
      Individual::Individual((Individual *)local_148,pIVar6);
      iVar2 = rand();
      if (iVar2 % 2 == 0) {
        Individual::mutate((Individual *)local_148);
      }
      Individual::~Individual((Individual *)local_148);
      __gnu_cxx::
      __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_>::
      operator++(&__end2);
    }
    std::
    __shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>::
    swap(&(this->population).
          super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
         ,(__shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
           *)local_90);
    std::shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_>::~shared_ptr
              ((shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_> *)local_90);
  }
  startingSize._2_1_ = 1;
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,
             "Wanted to rewrite more individuals to next population that there is individuals",
             (allocator *)((long)&startingSize + 3));
  startingSize._2_1_ = 0;
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

Result GeneticAlgorithm::operator()(std::shared_ptr<Instance> instance) {
	auto start = high_resolution_clock::now();
	auto end = start + seconds(5);

	initializePopulation(instance);

	while(high_resolution_clock::now() < end){
		std::sort(population->begin(), population->end(), [&instance](Individual& a, Individual& b) { return a.valueFunction(instance) < b.valueFunction(instance); } );

		std::shared_ptr<std::vector<Individual>> newPopulation = std::make_shared<vector<Individual>>();
		int rewriteToNextPopulationCount = 20;
		
		if(rewriteToNextPopulationCount > population->size()) throw std::string("Wanted to rewrite more individuals to next population that there is individuals");

		for(int i = 0; i < rewriteToNextPopulationCount; i++){
			newPopulation->push_back(population->at(i));
		}

		int startingSize = newPopulation->size();
		for(int i = 0; i < startingSize; i++){
			Individual father = newPopulation->at(i);
			for(int j = 0; j < startingSize; j++){
				if(i != j){
					Individual& mother = newPopulation->at(j);
					Individual child = father.makeOffspring(mother);
					newPopulation->push_back(child);
				}
			}
		}

		for(Individual ind : *newPopulation){
			if(rand()%2 == 0)
				ind.mutate();
		}

		population.swap(newPopulation);
	}
	return (Result)returnBestIndividual(instance);
}